

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::setup_for_solve(HModel *this)

{
  reference pvVar1;
  long in_RDI;
  double dVar2;
  double *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_0000003c;
  HMatrix *in_stack_00000040;
  int *in_stack_00000050;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  HModel *in_stack_ffffffffffffff80;
  HModel *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  reference in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  reference in_stack_ffffffffffffffc8;
  HFactor *in_stack_ffffffffffffffd0;
  int numRow_;
  int numCol_;
  HMatrix *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  HTimer::reset((HTimer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (*(int *)(in_RDI + 0x610) != 0) {
    initRandomVec(in_stack_ffffffffffffff90);
    if (*(int *)(in_RDI + 0x5e0) == 0) {
      replaceWithLogicalBasis(in_stack_ffffffffffffff80);
    }
    else {
      setup_numBasicLogicals
                ((HModel *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    if ((*(int *)(in_RDI + 0x5e4) == 0) || (*(int *)(in_RDI + 0x5e8) == 0)) {
      if (*(int *)(in_RDI + 0x578) == *(int *)(in_RDI + 0x610)) {
        in_stack_ffffffffffffffd0 = (HFactor *)(in_RDI + 0x8d0);
        numRow_ = *(int *)(in_RDI + 0x60c);
        numCol_ = *(int *)(in_RDI + 0x610);
        in_stack_ffffffffffffffe0 =
             (HMatrix *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),0);
        in_stack_ffffffffffffffe8 = (int)pvVar1;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),0);
        HMatrix::setup_lgBs(in_stack_ffffffffffffffe0,numCol_,numRow_,
                            &in_stack_ffffffffffffffd0->pseudoTick,(int *)in_stack_ffffffffffffffc8,
                            in_stack_ffffffffffffffc0);
      }
      else {
        in_stack_ffffffffffffffb0 = *(undefined4 *)(in_RDI + 0x60c);
        in_stack_ffffffffffffffb4 = *(undefined4 *)(in_RDI + 0x610);
        in_stack_ffffffffffffffb8 =
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
        in_stack_ffffffffffffffc0 =
             (double *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),0);
        in_stack_ffffffffffffffc8 =
             std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),0);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),0);
        HMatrix::setup(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030,
                       in_stack_00000028,in_stack_00000020,in_stack_00000050);
      }
      *(undefined4 *)(in_RDI + 0x5e4) = 1;
      *(undefined4 *)(in_RDI + 0x5e8) = 1;
    }
    if (*(int *)(in_RDI + 0x5ec) == 0) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),0);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),0);
      in_stack_ffffffffffffff70 = 1;
      HFactor::setup(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (int)in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,
                     (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     &in_stack_ffffffffffffffe0->numCol,in_stack_ffffffffffffffe8);
      *(undefined4 *)(in_RDI + 0x5ec) = 1;
      *(undefined4 *)(in_RDI + 0x580) = 5000;
    }
    dVar2 = HTimer::getTime((HTimer *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    *(double *)(in_RDI + 0x568) = dVar2 + *(double *)(in_RDI + 0x568);
  }
  return;
}

Assistant:

void HModel::setup_for_solve() {
  timer.reset();
  if (numRow == 0) return;
  
  // Initialise the real and integer random vectors
  initRandomVec();

  //  mlFg_Report();cout<<flush;
  //  printf("In setup_fromModelLgBs: mlFg_haveBasis = %d \n", mlFg_haveBasis);cout<<flush;
  if (mlFg_haveBasis) {
    // Model has a basis so just count the number of basic logicals
    setup_numBasicLogicals(); 
  }
  else {
    // Model has no basis: set up a logical basis then populate (where
    // possible) work* arrays
    replaceWithLogicalBasis();
    //    printf("Called replaceWithLogicalBasis\n");cout<<flush;
  }

  if (!(mlFg_haveMatrixColWise && mlFg_haveMatrixRowWise)) {
    // Make a copy of col-wise matrix for HMatrix and create its row-wise matrix
    if (numBasicLogicals == numRow) {
      matrix.setup_lgBs(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0]);
      //      printf("Called matrix.setup_lgBs\n");cout<<flush;
    } else {
      matrix.setup(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0], &nonbasicFlag[0]);
      //      printf("Called matrix.setup\n");cout<<flush;
    }
    //Indicate that there is a colum-wise and row-wise copy of the
    //matrix: can't be done in matrix.setup_lgBs
    mlFg_haveMatrixColWise = 1;
    mlFg_haveMatrixRowWise = 1;
  }

  if (!mlFg_haveFactorArrays) {
    // Initialise factor arrays, passing &basicIndex[0] so that its
    // address can be copied to the internal Factor pointer
    factor.setup(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0], &basicIndex[0]);
    // Indicate that the model has factor arrays: can't be done in factor.setup
    mlFg_haveFactorArrays = 1;
    limitUpdate = 5000;
  }

  // Save the input time
  totalTime += timer.getTime();
}